

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O1

string_view mjs::trim(string_view *s)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  string_view sVar6;
  
  uVar1 = s->_M_len;
  uVar4 = uVar1;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  else {
    pcVar2 = s->_M_str;
    uVar5 = 0;
    do {
      iVar3 = isblank((int)pcVar2[uVar5]);
      if (iVar3 == 0) goto LAB_00125057;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
    uVar5 = uVar1;
  }
LAB_00125057:
  if (uVar4 != 0) {
    pcVar2 = s->_M_str;
    do {
      iVar3 = isblank((int)pcVar2[uVar4 + (uVar5 - 1)]);
      if (iVar3 == 0) goto LAB_0012507e;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
  }
LAB_0012507e:
  if (uVar5 <= uVar1) {
    if (uVar1 - uVar5 < uVar4) {
      uVar4 = uVar1 - uVar5;
    }
    sVar6._M_str = s->_M_str + uVar5;
    sVar6._M_len = uVar4;
    return sVar6;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar5,
             uVar1);
}

Assistant:

std::string_view trim(const std::string_view& s) {
    size_t pos = 0, len = s.length();
    while (pos < s.length() && isblank(s[pos]))
        ++pos, --len;
    while (len && isblank(s[pos+len-1]))
        --len;
    return s.substr(pos, len);
}